

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O3

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::EnsureLdFldInlinee
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionBody *inlinee)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar7;
  FunctionCodeGenRuntimeData *pFVar8;
  undefined1 local_70 [8];
  TrackAllocData data;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> inlineeData;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xac,"(recycler)","recycler");
    if (!bVar2) goto LAB_0096fd20;
    *puVar5 = 0;
  }
  uVar3 = FunctionBody::GetCountField((this->functionBody).ptr,InlineCacheCount);
  if (uVar3 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xad,"(inlineCacheIndex < functionBody->GetInlineCacheCount())",
                                "inlineCacheIndex < functionBody->GetInlineCacheCount()");
    if (!bVar2) goto LAB_0096fd20;
    *puVar5 = 0;
  }
  if (inlinee == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xae,"(inlinee)","inlinee");
    if (!bVar2) goto LAB_0096fd20;
    *puVar5 = 0;
  }
  addr = &this->ldFldInlinees;
  pWVar7 = (this->ldFldInlinees).ptr;
  if (pWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    uVar3 = FunctionBody::GetCountField((this->functionBody).ptr,InlineCacheCount);
    data.plusSize = (size_t)uVar3;
    local_70 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4aeb28e;
    data.filename._0_4_ = 0xb2;
    pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    uVar3 = FunctionBody::GetCountField((this->functionBody).ptr,InlineCacheCount);
    if (uVar3 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
      pWVar7 = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_0096fd20;
        *puVar5 = 0;
      }
      pWVar7 = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)
               Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (pRVar6,(ulong)uVar3 << 3);
      if (pWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_0096fd20:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      memset(pWVar7,0,(ulong)uVar3 << 3);
    }
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pWVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pWVar7 = addr->ptr;
  }
  pFVar8 = pWVar7[inlineCacheIndex].ptr;
  Memory::Recycler::WBSetBit((char *)&data.line);
  data._32_8_ = pFVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&data.line);
  if (data._32_8_ == 0) {
    local_70 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4aeb28e;
    data.filename._0_4_ = 0xb7;
    pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    pFVar8 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar6,0x387914);
    FunctionCodeGenRuntimeData(pFVar8,inlinee);
    pWVar7 = addr->ptr + inlineCacheIndex;
    Memory::Recycler::WBSetBit((char *)pWVar7);
    pWVar7->ptr = pFVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar7);
    data._32_8_ = pWVar7->ptr;
  }
  return (FunctionCodeGenRuntimeData *)data._32_8_;
}

Assistant:

FunctionCodeGenRuntimeData *FunctionCodeGenRuntimeData::EnsureLdFldInlinee(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(inlineCacheIndex < functionBody->GetInlineCacheCount());
        Assert(inlinee);

        if (!ldFldInlinees)
        {
            ldFldInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData *), functionBody->GetInlineCacheCount());
        }
        const auto inlineeData = ldFldInlinees[inlineCacheIndex];
        if (!inlineeData)
        {
            return ldFldInlinees[inlineCacheIndex] = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
        }
        return inlineeData;
    }